

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O1

void __thiscall Assimp::XFileParser::ParseDataObjectTemplate(XFileParser *this)

{
  int iVar1;
  string s;
  string name;
  string guid;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  readHeadOfDataObject(this,&local_70);
  GetNextToken_abi_cxx11_(&local_50,this);
  do {
    GetNextToken_abi_cxx11_(&local_b0,this);
    iVar1 = std::__cxx11::string::compare((char *)&local_b0);
    if ((iVar1 != 0) && (local_b0._M_string_length == 0)) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,
                 "Unexpected end of file reached while parsing template definition","");
      ThrowException(this,&local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  } while (iVar1 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void XFileParser::ParseDataObjectTemplate()
{
    // parse a template data object. Currently not stored.
    std::string name;
    readHeadOfDataObject( &name);

    // read GUID
    std::string guid = GetNextToken();

    // read and ignore data members
    bool running = true;
    while ( running )
    {
        std::string s = GetNextToken();

        if( s == "}")
            break;

        if( s.length() == 0)
            ThrowException( "Unexpected end of file reached while parsing template definition");
    }
}